

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O1

void ppMul7(word *c,word *a,word *b,void *stack)

{
  ppMul4(c,a,b,stack);
  ppMul3(c + 8,a + 4,b + 4,stack);
  *(word *)stack = a[4] ^ *a;
  *(word *)((long)stack + 8) = a[5] ^ a[1];
  *(word *)((long)stack + 0x10) = a[6] ^ a[2];
  *(word *)((long)stack + 0x18) = a[3];
  *(word *)((long)stack + 0x20) = b[4] ^ *b;
  *(word *)((long)stack + 0x28) = b[5] ^ b[1];
  *(word *)((long)stack + 0x30) = b[6] ^ b[2];
  *(word *)((long)stack + 0x38) = b[3];
  *(word *)((long)stack + 0x40) = c[8] ^ c[4];
  *(word *)((long)stack + 0x48) = c[9] ^ c[5];
  *(word *)((long)stack + 0x50) = c[10] ^ c[6];
  *(word *)((long)stack + 0x58) = c[0xb] ^ c[7];
  ppMul4(c + 4,(word *)stack,(word *)((long)stack + 0x20),(void *)((long)stack + 0x60));
  c[4] = c[4] ^ *(ulong *)((long)stack + 0x40) ^ *c;
  c[5] = c[5] ^ *(ulong *)((long)stack + 0x48) ^ c[1];
  c[6] = c[6] ^ *(ulong *)((long)stack + 0x50) ^ c[2];
  c[7] = c[7] ^ *(ulong *)((long)stack + 0x58) ^ c[3];
  c[8] = c[8] ^ *(ulong *)((long)stack + 0x40) ^ c[0xc];
  c[9] = c[9] ^ *(ulong *)((long)stack + 0x48) ^ c[0xd];
  c[10] = c[10] ^ *(ulong *)((long)stack + 0x50);
  c[0xb] = c[0xb] ^ *(ulong *)((long)stack + 0x58);
  return;
}

Assistant:

static void ppMul7(word c[14], const word a[7], const word b[7], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 7, c, 14));
	ASSERT(wwIsDisjoint2(b, 7, c, 14));
	// c1 || c0 <- a0 b0
	ppMul4(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul3(c + 8, a + 4, b + 4, t);
	// t0 <- a0 + a1
	t[0] = a[0] ^ a[4];
	t[1] = a[1] ^ a[5];
	t[2] = a[2] ^ a[6];
	t[3] = a[3];
	// t1 <- b0 + b1
	t[4] = b[0] ^ b[4];
	t[5] = b[1] ^ b[5];
	t[6] = b[2] ^ b[6];
	t[7] = b[3];
	// t2 <- c1 + c2
	t[8] = c[4] ^ c[8];
	t[9] = c[5] ^ c[9];
	t[10] = c[6] ^ c[10];
	t[11] = c[7] ^ c[11];
	// c2 || c1 <- t0 t1
	ppMul4(c + 4, t, t + 4, t + 12);
	// c1 <- c1 + c0 + t2
	c[4] ^= c[0] ^ t[8];
	c[5] ^= c[1] ^ t[9];
	c[6] ^= c[2] ^ t[10];
	c[7] ^= c[3] ^ t[11];
	// c2 <- c2 + c3 + t2
	c[8] ^= c[12] ^ t[8];
	c[9] ^= c[13] ^ t[9];
	c[10] ^= t[10];
	c[11] ^= t[11];
}